

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__calculate_filters
               (stbir__sampler *samp,stbir__sampler *other_axis_for_pivot,void *user_data)

{
  long lVar1;
  bool bVar2;
  stbir__sampler *psVar3;
  float *pfVar4;
  stbir__contributors *psVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  stbir__contributors *psVar9;
  stbir_uint32 num_contributors;
  uint uVar10;
  long lVar11;
  int iVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  stbir_uint32 sVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int local_e0;
  float *local_d0;
  int local_c0;
  int out_first_pixel;
  stbir__contributors *local_b8;
  ulong local_b0;
  long local_a8;
  float local_9c;
  long local_98;
  void *local_90;
  long local_88;
  stbir__sampler *local_80;
  ulong local_78;
  stbir__contributors *local_70;
  ulong local_68;
  stbir__kernel_callback *local_60;
  stbir__scale_info *local_58;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_58 = &samp->scale_info;
  fVar19 = (samp->scale_info).scale;
  local_a8 = CONCAT44(local_a8._4_4_,fVar19);
  local_60 = samp->filter_kernel;
  fVar20 = (samp->scale_info).inv_scale;
  num_contributors = samp->num_contributors;
  local_b8 = samp->contributors;
  local_d0 = samp->coefficients;
  local_e0 = samp->coefficient_width;
  iVar12 = samp->is_gather;
  local_90 = user_data;
  local_80 = samp;
  local_98._0_4_ = fVar20;
  if ((iVar12 != 0) && (iVar12 != 2)) {
    if (iVar12 != 1) {
      return;
    }
    fVar19 = (*samp->filter_support)(fVar20,user_data);
    local_a8 = CONCAT44(local_a8._4_4_,(float)local_a8 * fVar19);
    local_9c = (float)samp->edge;
    fVar19 = (samp->scale_info).inv_scale;
    local_b0 = CONCAT44(local_b0._4_4_,(samp->scale_info).pixel_shift);
    sVar17 = (samp->scale_info).scale_numerator;
    if ((int)num_contributors <= (int)sVar17) {
      sVar17 = num_contributors;
    }
    local_88 = CONCAT44(local_88._4_4_,(samp->scale_info).input_full_size);
    if ((samp->scale_info).scale_is_rational == 0) {
      sVar17 = num_contributors;
    }
    local_68 = (ulong)(local_e0 - 1);
    uVar6 = 0;
    if ((int)sVar17 < 1) {
      sVar17 = 0;
    }
    local_50 = CONCAT44(local_50._4_4_,sVar17);
    local_98 = (long)local_e0 << 2;
    psVar9 = local_b8;
    pfVar13 = local_d0;
LAB_00193f03:
    if ((int)uVar6 == (int)local_50) {
      stbir__cleanup_gathered_coefficients
                (samp->edge,&samp->extent_info,local_58,num_contributors,local_b8,local_d0,local_e0)
      ;
      return;
    }
    fVar20 = (float)(int)uVar6 + 0.5;
    fVar21 = (float)local_b0 + fVar20;
    local_78 = uVar6;
    local_70 = psVar9;
    stbir__calculate_in_pixel_range
              (&out_first_pixel,&local_c0,fVar20,(float)local_a8,fVar19,(float)local_b0,
               (int)local_88,(stbir_edge)local_9c);
    iVar12 = (int)local_68 + out_first_pixel;
    if (local_c0 - out_first_pixel < local_e0) {
      iVar12 = local_c0;
    }
    uVar6 = 0xffffffff;
    iVar14 = out_first_pixel;
LAB_00193f87:
    uVar18 = 0;
    do {
      iVar7 = (int)uVar18;
      if (iVar12 - iVar14 < iVar7) {
        local_70->n0 = iVar14;
        local_70->n1 = (int)uVar6 + iVar14;
        if ((int)uVar6 < 0) {
          __assert_fail("contributors->n1 >= contributors->n0",
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0xcfa,
                        "void stbir__calculate_coefficients_for_gather_upsample(float, stbir__kernel_callback *, stbir__scale_info *, int, stbir__contributors *, float *, int, stbir_edge, void *)"
                       );
        }
        psVar9 = local_70 + 1;
        uVar6 = (ulong)((int)local_78 + 1);
        pfVar13 = (float *)((long)pfVar13 + local_98);
        samp = local_80;
        goto LAB_00193f03;
      }
      fVar20 = (*local_60)(fVar21 * fVar19 - ((float)(iVar7 + iVar14) + 0.5),fVar19,local_90);
      if (7.523164e-37 <= ABS(fVar20)) {
        uVar6 = uVar18 & 0xffffffff;
      }
      else {
        fVar20 = 0.0;
        if (iVar7 == 0) goto LAB_00193fef;
      }
      pfVar13[uVar18] = fVar20;
      uVar18 = uVar18 + 1;
    } while( true );
  }
  iVar12 = (samp->scale_info).input_full_size;
  fVar19 = (*samp->filter_support)(fVar19,user_data);
  uVar8 = samp->filter_pixel_margin;
  local_b0 = (ulong)uVar8;
  if (samp->is_gather == 0) {
    if (other_axis_for_pivot != (stbir__sampler *)0x0) {
      local_b8 = other_axis_for_pivot->contributors;
      local_d0 = other_axis_for_pivot->coefficients;
      local_88 = (long)other_axis_for_pivot->coefficient_width;
      num_contributors = other_axis_for_pivot->num_contributors;
      (samp->extent_info).lowest = (other_axis_for_pivot->extent_info).lowest;
      (samp->extent_info).highest = (other_axis_for_pivot->extent_info).highest;
      (samp->extent_info).widest = (other_axis_for_pivot->extent_info).widest;
      goto LAB_001943a6;
    }
    local_b8 = samp->gather_prescatter_contributors;
    local_d0 = samp->gather_prescatter_coefficients;
    local_e0 = samp->gather_prescatter_coefficient_width;
    num_contributors = samp->gather_prescatter_num_contributors;
  }
  local_98._0_4_ = (float)local_98 * fVar19;
  local_3c = iVar12 + uVar8;
  iVar7 = -uVar8;
  fVar19 = (samp->scale_info).scale;
  local_68 = CONCAT44(local_68._4_4_,(samp->scale_info).pixel_shift);
  iVar12 = (samp->scale_info).output_sub_size;
  uVar8 = (samp->scale_info).scale_numerator;
  local_38 = (ulong)uVar8;
  iVar14 = (samp->scale_info).scale_is_rational;
  bVar2 = (int)uVar8 < iVar12;
  local_44 = uVar8 - 1;
  local_88 = (long)local_e0;
  if (local_3c < iVar7) {
    local_3c = iVar7;
  }
  local_a8 = local_88 * 4;
  uVar6 = 0xffffffffffffffff;
  local_40 = iVar12;
  iVar15 = local_3c;
  while( true ) {
    if (iVar7 == iVar15) break;
    local_78 = CONCAT44(local_78._4_4_,(float)iVar7 + 0.5);
    stbir__calculate_out_pixel_range
              (&out_first_pixel,&local_c0,(float)iVar7 + 0.5,(float)local_98,fVar19,(float)local_68,
               iVar12);
    psVar9 = local_b8;
    local_70 = (stbir__contributors *)(ulong)(uint)out_first_pixel;
    if (out_first_pixel <= local_c0) {
      iVar12 = local_c0;
      if (bVar2 && iVar14 != 0) {
        if (out_first_pixel == (int)local_38) break;
        if ((int)local_38 <= local_c0) {
          iVar12 = local_44;
        }
      }
      lVar11 = (long)out_first_pixel;
      local_9c = (float)local_68 - (float)local_78 * fVar19;
      local_78 = (ulong)(iVar12 - out_first_pixel);
      pfVar13 = (float *)(local_a8 * lVar11 + (long)local_d0);
      local_50 = lVar11;
      for (lVar16 = 0; iVar12 = local_40, iVar15 = local_3c, lVar16 <= (long)local_78;
          lVar16 = lVar16 + 1) {
        uVar18 = (long)&local_70->n0 + lVar16;
        iVar12 = (int)uVar18;
        lVar1 = lVar16 + local_50;
        fVar20 = (*local_60)((float)iVar12 + 0.5 + local_9c,fVar19,local_90);
        if ((int)uVar6 < lVar1) {
          if (iVar12 != (int)uVar6 + 1) {
            __assert_fail("out == ( first_out_inited + 1 )",
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0xd6d,
                          "void stbir__calculate_coefficients_for_gather_downsample(int, int, float, stbir__kernel_callback *, stbir__scale_info *, int, int, stbir__contributors *, float *, void *)"
                         );
          }
          psVar9[lVar11 + lVar16].n0 = iVar7;
          psVar9[lVar11 + lVar16].n1 = iVar7;
          uVar6 = uVar18 & 0xffffffff;
          pfVar4 = pfVar13;
        }
        else {
          iVar12 = psVar9[lVar11 + lVar16].n0;
          if ((*pfVar13 == 0.0) && (!NAN(*pfVar13))) {
            if (iVar7 - iVar12 != 1) {
              __assert_fail("( in_pixel - contribs->n0 ) == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                            ,0xd78,
                            "void stbir__calculate_coefficients_for_gather_downsample(int, int, float, stbir__kernel_callback *, stbir__scale_info *, int, int, stbir__contributors *, float *, void *)"
                           );
            }
            psVar9[lVar11 + lVar16].n0 = iVar7;
            iVar12 = iVar7;
          }
          psVar9[lVar11 + lVar16].n1 = iVar7;
          if (local_e0 <= iVar7 - iVar12) {
            __assert_fail("( in_pixel - contribs->n0 ) < coefficient_width",
                          "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                          ,0xd7c,
                          "void stbir__calculate_coefficients_for_gather_downsample(int, int, float, stbir__kernel_callback *, stbir__scale_info *, int, int, stbir__contributors *, float *, void *)"
                         );
          }
          pfVar4 = local_d0 + lVar1 * local_88 + (long)(iVar7 - iVar12);
        }
        *pfVar4 = (float)(~-(uint)(ABS(fVar20 * fVar19) < 7.523164e-37) & (uint)(fVar20 * fVar19));
        pfVar13 = (float *)((long)pfVar13 + local_a8);
      }
    }
    iVar7 = iVar7 + 1;
  }
  psVar3 = local_80;
  stbir__cleanup_gathered_coefficients
            (local_80->edge,&local_80->extent_info,local_58,num_contributors,local_b8,local_d0,
             local_e0);
  if (psVar3->is_gather != 0) {
    return;
  }
LAB_001943a6:
  sVar17 = 0;
  if ((int)num_contributors < 1) {
    num_contributors = sVar17;
  }
  uVar8 = ~(uint)local_b0;
  do {
    if (sVar17 == num_contributors) {
      psVar5 = local_80->contributors;
      iVar12 = local_80->num_contributors;
      psVar9 = psVar5 + (int)(uVar8 + (int)(float)local_b0);
      while (psVar9 = psVar9 + 1, psVar9 < psVar5 + iVar12) {
        psVar9->n0 = 0;
        psVar9->n1 = -1;
      }
      return;
    }
    uVar10 = local_b8->n0;
    iVar12 = local_b8->n1;
    iVar14 = local_80->coefficient_width;
    pfVar13 = local_80->coefficients + (long)iVar14 * (long)(int)((int)(float)local_b0 + uVar10);
    psVar9 = local_80->contributors + (int)((int)(float)local_b0 + uVar10);
    local_60 = (stbir__kernel_callback *)CONCAT44(local_60._4_4_,iVar12);
    pfVar4 = local_d0;
    for (; (int)uVar10 <= iVar12; uVar10 = uVar10 + 1) {
      fVar19 = *pfVar4;
      if (7.523164e-37 <= ABS(fVar19)) {
        if (((int)uVar8 < (int)uVar10) || (psVar9->n1 < psVar9->n0)) {
          psVar5 = local_80->contributors + (int)(uVar8 + (int)(float)local_b0);
          while (psVar5 = psVar5 + 1, psVar5 < psVar9) {
            psVar5->n0 = 0;
            psVar5->n1 = -1;
          }
          psVar9->n0 = sVar17;
          psVar9->n1 = sVar17;
          *pfVar13 = fVar19;
          uVar8 = uVar10;
        }
        else {
          local_90 = (void *)CONCAT44(local_90._4_4_,uVar8);
          stbir__insert_coeff(psVar9,pfVar13,sVar17,fVar19,iVar14);
          uVar8 = (uint)local_90;
          iVar12 = (int)local_60;
        }
        if (iVar14 <= psVar9->n1 - psVar9->n0) {
          __assert_fail("( scatter_contributors->n1 - scatter_contributors->n0 + 1 ) <= scatter_coefficient_width"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                        ,0xf92,
                        "void stbir__calculate_filters(stbir__sampler *, stbir__sampler *, void *)")
          ;
        }
      }
      pfVar4 = pfVar4 + 1;
      psVar9 = psVar9 + 1;
      pfVar13 = pfVar13 + iVar14;
    }
    local_b8 = local_b8 + 1;
    local_d0 = local_d0 + local_88;
    sVar17 = sVar17 + 1;
  } while( true );
LAB_00193fef:
  if (iVar12 == iVar14) {
    __assert_fail("( in_last_pixel - in_first_pixel ) != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_image_resize2.h"
                  ,0xce9,
                  "void stbir__calculate_coefficients_for_gather_upsample(float, stbir__kernel_callback *, stbir__scale_info *, int, stbir__contributors *, float *, int, stbir_edge, void *)"
                 );
  }
  iVar14 = iVar14 + 1;
  goto LAB_00193f87;
}

Assistant:

static void stbir__calculate_filters( stbir__sampler * samp, stbir__sampler * other_axis_for_pivot, void * user_data STBIR_ONLY_PROFILE_BUILD_GET_INFO )
{
  int n;
  float scale = samp->scale_info.scale;
  stbir__kernel_callback * kernel = samp->filter_kernel;
  stbir__support_callback * support = samp->filter_support;
  float inv_scale = samp->scale_info.inv_scale;
  int input_full_size = samp->scale_info.input_full_size;
  int gather_num_contributors = samp->num_contributors;
  stbir__contributors* gather_contributors = samp->contributors;
  float * gather_coeffs = samp->coefficients;
  int gather_coefficient_width = samp->coefficient_width;

  switch ( samp->is_gather )
  {
    case 1: // gather upsample
    {
      float out_pixels_radius = support(inv_scale,user_data) * scale;

      stbir__calculate_coefficients_for_gather_upsample( out_pixels_radius, kernel, &samp->scale_info, gather_num_contributors, gather_contributors, gather_coeffs, gather_coefficient_width, samp->edge, user_data );

      STBIR_PROFILE_BUILD_START( cleanup );
      stbir__cleanup_gathered_coefficients( samp->edge, &samp->extent_info, &samp->scale_info, gather_num_contributors, gather_contributors, gather_coeffs, gather_coefficient_width );
      STBIR_PROFILE_BUILD_END( cleanup );
    }
    break;

    case 0: // scatter downsample (only on vertical)
    case 2: // gather downsample
    {
      float in_pixels_radius = support(scale,user_data) * inv_scale;
      int filter_pixel_margin = samp->filter_pixel_margin;
      int input_end = input_full_size + filter_pixel_margin;

      // if this is a scatter, we do a downsample gather to get the coeffs, and then pivot after
      if ( !samp->is_gather )
      {
        // check if we are using the same gather downsample on the horizontal as this vertical,
        //   if so, then we don't have to generate them, we can just pivot from the horizontal.
        if ( other_axis_for_pivot )
        {
          gather_contributors = other_axis_for_pivot->contributors;
          gather_coeffs = other_axis_for_pivot->coefficients;
          gather_coefficient_width = other_axis_for_pivot->coefficient_width;
          gather_num_contributors = other_axis_for_pivot->num_contributors;
          samp->extent_info.lowest = other_axis_for_pivot->extent_info.lowest;
          samp->extent_info.highest = other_axis_for_pivot->extent_info.highest;
          samp->extent_info.widest = other_axis_for_pivot->extent_info.widest;
          goto jump_right_to_pivot;
        }

        gather_contributors = samp->gather_prescatter_contributors;
        gather_coeffs = samp->gather_prescatter_coefficients;
        gather_coefficient_width = samp->gather_prescatter_coefficient_width;
        gather_num_contributors = samp->gather_prescatter_num_contributors;
      }

      stbir__calculate_coefficients_for_gather_downsample( -filter_pixel_margin, input_end, in_pixels_radius, kernel, &samp->scale_info, gather_coefficient_width, gather_num_contributors, gather_contributors, gather_coeffs, user_data );

      STBIR_PROFILE_BUILD_START( cleanup );
      stbir__cleanup_gathered_coefficients( samp->edge, &samp->extent_info, &samp->scale_info, gather_num_contributors, gather_contributors, gather_coeffs, gather_coefficient_width );
      STBIR_PROFILE_BUILD_END( cleanup );

      if ( !samp->is_gather )
      {
        // if this is a scatter (vertical only), then we need to pivot the coeffs
        stbir__contributors * scatter_contributors;
        int highest_set;

        jump_right_to_pivot:

        STBIR_PROFILE_BUILD_START( pivot );

        highest_set = (-filter_pixel_margin) - 1;
        for (n = 0; n < gather_num_contributors; n++)
        {
          int k;
          int gn0 = gather_contributors->n0, gn1 = gather_contributors->n1;
          int scatter_coefficient_width = samp->coefficient_width;
          float * scatter_coeffs = samp->coefficients + ( gn0 + filter_pixel_margin ) * scatter_coefficient_width;
          float * g_coeffs = gather_coeffs;
          scatter_contributors = samp->contributors + ( gn0 + filter_pixel_margin );

          for (k = gn0 ; k <= gn1 ; k++ )
          {
            float gc = *g_coeffs++;
            
            // skip zero and denormals - must skip zeros to avoid adding coeffs beyond scatter_coefficient_width
            //   (which happens when pivoting from horizontal, which might have dummy zeros)
            if ( ( ( gc >= stbir__small_float ) || ( gc <= -stbir__small_float ) ) )
            {
              if ( ( k > highest_set ) || ( scatter_contributors->n0 > scatter_contributors->n1 ) )
              {
                {
                  // if we are skipping over several contributors, we need to clear the skipped ones
                  stbir__contributors * clear_contributors = samp->contributors + ( highest_set + filter_pixel_margin + 1);
                  while ( clear_contributors < scatter_contributors )
                  {
                    clear_contributors->n0 = 0;
                    clear_contributors->n1 = -1;
                    ++clear_contributors;
                  }
                }
                scatter_contributors->n0 = n;
                scatter_contributors->n1 = n;
                scatter_coeffs[0]  = gc;
                highest_set = k;
              }
              else
              {
                stbir__insert_coeff( scatter_contributors, scatter_coeffs, n, gc, scatter_coefficient_width );
              }
              STBIR_ASSERT( ( scatter_contributors->n1 - scatter_contributors->n0 + 1 ) <= scatter_coefficient_width );
            }
            ++scatter_contributors;
            scatter_coeffs += scatter_coefficient_width;
          }

          ++gather_contributors;
          gather_coeffs += gather_coefficient_width;
        }

        // now clear any unset contribs
        {
          stbir__contributors * clear_contributors = samp->contributors + ( highest_set + filter_pixel_margin + 1);
          stbir__contributors * end_contributors = samp->contributors + samp->num_contributors;
          while ( clear_contributors < end_contributors )
          {
            clear_contributors->n0 = 0;
            clear_contributors->n1 = -1;
            ++clear_contributors;
          }
        }

        STBIR_PROFILE_BUILD_END( pivot );
      }
    }
    break;
  }
}